

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_adjust_idle_stream(nghttp2_session *session)

{
  nghttp2_session *session_00;
  uint32_t uVar1;
  int iVar2;
  long in_RDI;
  nghttp2_stream *next;
  nghttp2_stream *head;
  int rv;
  size_t max;
  nghttp2_stream *stream;
  
  uVar1 = nghttp2_min_uint32(*(uint32_t *)(in_RDI + 0xb4c),*(uint32_t *)(in_RDI + 0xb68));
  uVar1 = nghttp2_max_uint32(0x10,uVar1);
  uVar1 = nghttp2_min_uint32(100,uVar1);
  while( true ) {
    if (*(ulong *)(in_RDI + 0xab0) <= (ulong)uVar1) {
      return 0;
    }
    session_00 = *(nghttp2_session **)(in_RDI + 0xa48);
    if (session_00 == (nghttp2_session *)0x0) break;
    stream = (session_00->root).dep_next;
    iVar2 = nghttp2_session_destroy_stream(session_00,stream);
    if (iVar2 != 0) {
      return iVar2;
    }
    *(nghttp2_stream **)(in_RDI + 0xa48) = stream;
    if (*(long *)(in_RDI + 0xa48) == 0) {
      *(undefined8 *)(in_RDI + 0xa50) = 0;
    }
    else {
      *(undefined8 *)(*(long *)(in_RDI + 0xa48) + 0x80) = 0;
    }
    *(long *)(in_RDI + 0xab0) = *(long *)(in_RDI + 0xab0) + -1;
  }
  __assert_fail("head",
                "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                ,0x6ad,"int nghttp2_session_adjust_idle_stream(nghttp2_session *)");
}

Assistant:

int nghttp2_session_adjust_idle_stream(nghttp2_session *session) {
  size_t max;
  int rv;

  /* Make minimum number of idle streams 16, and maximum 100, which
     are arbitrary chosen numbers. */
  max = nghttp2_min_uint32(
    100,
    nghttp2_max_uint32(
      16, nghttp2_min_uint32(session->local_settings.max_concurrent_streams,
                             session->pending_local_max_concurrent_stream)));

  DEBUGF("stream: adjusting kept idle streams num_idle_streams=%zu, max=%zu\n",
         session->num_idle_streams, max);

  while (session->num_idle_streams > max) {
    nghttp2_stream *head;
    nghttp2_stream *next;

    head = session->idle_stream_head;
    assert(head);

    next = head->closed_next;

    rv = nghttp2_session_destroy_stream(session, head);
    if (rv != 0) {
      return rv;
    }

    /* head is now destroyed */

    session->idle_stream_head = next;

    if (session->idle_stream_head) {
      session->idle_stream_head->closed_prev = NULL;
    } else {
      session->idle_stream_tail = NULL;
    }

    --session->num_idle_streams;
  }

  return 0;
}